

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

string * cmsys::Glob::PatternToRegex
                   (string *__return_storage_ptr__,string *pattern,bool require_whole_string,
                   bool preserve_case)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  reference pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  int ch;
  const_iterator k;
  const_iterator bracket_last;
  const_iterator bracket_first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  int c;
  const_iterator i;
  const_iterator pattern_last;
  const_iterator pattern_first;
  allocator<char> local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  byte local_19;
  bool preserve_case_local;
  string *psStack_18;
  bool require_whole_string_local;
  string *pattern_local;
  string *regex;
  
  local_1b = 0;
  pcVar4 = "";
  if (require_whole_string) {
    pcVar4 = "^";
  }
  local_1a = preserve_case;
  local_19 = require_whole_string;
  psStack_18 = pattern;
  pattern_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar4,&local_1c);
  std::allocator<char>::~allocator(&local_1c);
  pcVar4 = (char *)std::__cxx11::string::begin();
  i._M_current = (char *)std::__cxx11::string::end();
  _Stack_48._M_current = pcVar4;
  while (bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffb8,&i), bVar2) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&stack0xffffffffffffffb8);
    cVar1 = *pcVar5;
    if (cVar1 == '*') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[^/]*");
    }
    else if (cVar1 == '?') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[^/]");
    }
    else if (cVar1 == '[') {
      _Var6 = __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&stack0xffffffffffffffb8,1);
      k._M_current = _Var6._M_current;
      bVar2 = __gnu_cxx::operator!=(&k,&i);
      if ((bVar2) &&
         ((pcVar5 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&k), *pcVar5 == '!' ||
          (pcVar5 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&k), *pcVar5 == '^')))) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&k);
      }
      bVar2 = __gnu_cxx::operator!=(&k,&i);
      if ((bVar2) &&
         (pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&k), *pcVar5 == ']')) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&k);
      }
      while( true ) {
        bVar3 = __gnu_cxx::operator!=(&k,&i);
        bVar2 = false;
        if (bVar3) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&k);
          bVar2 = *pcVar5 != ']';
        }
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&k);
      }
      bVar2 = __gnu_cxx::operator==(&k,&i);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\[");
      }
      else {
        _Stack_68 = _Var6;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
        bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff98,&k);
        if ((bVar2) &&
           (pcVar5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&stack0xffffffffffffff98), *pcVar5 == '!')) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"^");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&stack0xffffffffffffff98);
        }
        while (bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff98,&k), bVar2) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&stack0xffffffffffffff98);
          if (*pcVar5 == '\\') {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\");
          }
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&stack0xffffffffffffff98);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar5);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&stack0xffffffffffffff98);
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
        _Stack_48._M_current = k._M_current;
      }
    }
    else {
      if ((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
         ((cVar1 < '0' || ('9' < cVar1)))) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\");
      }
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&stack0xffffffffffffffb8);
  }
  if ((local_19 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Glob::PatternToRegex(const std::string& pattern,
                                 bool require_whole_string, bool preserve_case)
{
  // Incrementally build the regular expression from the pattern.
  std::string regex = require_whole_string ? "^" : "";
  std::string::const_iterator pattern_first = pattern.begin();
  std::string::const_iterator pattern_last = pattern.end();
  for (std::string::const_iterator i = pattern_first; i != pattern_last; ++i) {
    int c = *i;
    if (c == '*') {
      // A '*' (not between brackets) matches any string.
      // We modify this to not match slashes since the original glob
      // pattern documentation was meant for matching file name
      // components separated by slashes.
      regex += "[^/]*";
    } else if (c == '?') {
      // A '?' (not between brackets) matches any single character.
      // We modify this to not match slashes since the original glob
      // pattern documentation was meant for matching file name
      // components separated by slashes.
      regex += "[^/]";
    } else if (c == '[') {
      // Parse out the bracket expression.  It begins just after the
      // opening character.
      std::string::const_iterator bracket_first = i + 1;
      std::string::const_iterator bracket_last = bracket_first;

      // The first character may be complementation '!' or '^'.
      if (bracket_last != pattern_last &&
          (*bracket_last == '!' || *bracket_last == '^')) {
        ++bracket_last;
      }

      // If the next character is a ']' it is included in the brackets
      // because the bracket string may not be empty.
      if (bracket_last != pattern_last && *bracket_last == ']') {
        ++bracket_last;
      }

      // Search for the closing ']'.
      while (bracket_last != pattern_last && *bracket_last != ']') {
        ++bracket_last;
      }

      // Check whether we have a complete bracket string.
      if (bracket_last == pattern_last) {
        // The bracket string did not end, so it was opened simply by
        // a '[' that is supposed to be matched literally.
        regex += "\\[";
      } else {
        // Convert the bracket string to its regex equivalent.
        std::string::const_iterator k = bracket_first;

        // Open the regex block.
        regex += "[";

        // A regex range complement uses '^' instead of '!'.
        if (k != bracket_last && *k == '!') {
          regex += "^";
          ++k;
        }

        // Convert the remaining characters.
        for (; k != bracket_last; ++k) {
          // Backslashes must be escaped.
          if (*k == '\\') {
            regex += "\\";
          }

          // Store this character.
          regex += *k;
        }

        // Close the regex block.
        regex += "]";

        // Jump to the end of the bracket string.
        i = bracket_last;
      }
    } else {
      // A single character matches itself.
      int ch = c;
      if (!(('a' <= ch && ch <= 'z') || ('A' <= ch && ch <= 'Z') ||
            ('0' <= ch && ch <= '9'))) {
        // Escape the non-alphanumeric character.
        regex += "\\";
      }
#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
      else {
        // On case-insensitive systems file names are converted to lower
        // case before matching.
        if (!preserve_case) {
          ch = tolower(ch);
        }
      }
#endif
      (void)preserve_case;
      // Store the character.
      regex.append(1, static_cast<char>(ch));
    }
  }

  if (require_whole_string) {
    regex += "$";
  }
  return regex;
}